

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cl_half.h
# Opt level: O0

cl_half cl_half_handle_overflow(cl_half_rounding_mode rounding_mode,uint16_t sign)

{
  uint16_t sign_local;
  cl_half_rounding_mode rounding_mode_local;
  
  if (rounding_mode == CL_HALF_RTZ) {
    sign_local = sign << 0xf | 0x7bff;
  }
  else if ((rounding_mode == CL_HALF_RTP) && (sign != 0)) {
    sign_local = 0xfbff;
  }
  else if ((rounding_mode == CL_HALF_RTN) && (sign == 0)) {
    sign_local = 0x7bff;
  }
  else {
    sign_local = sign << 0xf | 0x7c00;
  }
  return sign_local;
}

Assistant:

static inline cl_half cl_half_handle_overflow(cl_half_rounding_mode rounding_mode,
                                              uint16_t sign)
{
  if (rounding_mode == CL_HALF_RTZ)
  {
    // Round overflow towards zero -> largest finite number (preserving sign)
    return (sign << 15) | CL_HALF_MAX_FINITE_MAG;
  }
  else if (rounding_mode == CL_HALF_RTP && sign)
  {
    // Round negative overflow towards positive infinity -> most negative finite number
    return (1 << 15) | CL_HALF_MAX_FINITE_MAG;
  }
  else if (rounding_mode == CL_HALF_RTN && !sign)
  {
    // Round positive overflow towards negative infinity -> largest finite number
    return CL_HALF_MAX_FINITE_MAG;
  }

  // Overflow to infinity
  return (sign << 15) | CL_HALF_EXP_MASK;
}